

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

void __thiscall agr::savebuf::savebuf(savebuf *this,streambuf *sbuf)

{
  *(code **)this = sysconf;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::locale::locale((locale *)&this->field_0x38);
  *(undefined ***)this = &PTR__savebuf_0014b9e8;
  this->sbuf = sbuf;
  (this->save)._M_dataplus._M_p = (pointer)&(this->save).field_2;
  (this->save)._M_string_length = 0;
  (this->save).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

savebuf::savebuf( std::streambuf* sbuf ): 
   sbuf( sbuf ) 
   {}